

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandGen(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Pla_Man_t *pPVar5;
  char *pcVar6;
  uint fVerbose;
  int iVar7;
  char *pcVar8;
  bool bVar9;
  uint local_4c;
  uint local_48;
  uint local_44;
  
  uVar4 = 0;
  Extra_UtilGetoptReset();
  local_44 = 0x14;
  local_48 = 1;
  local_4c = 8;
  bVar9 = false;
  bVar1 = false;
  fVerbose = 0;
LAB_00306409:
  do {
    while( true ) {
      while (iVar2 = Extra_UtilGetopt(argc,argv,"IOPSspvh"), iVar7 = globalUtilOptind, iVar2 == 0x76
            ) {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar2 == -1) {
        if (bVar9) {
          Pla_GenSorter(local_4c);
          pPVar5 = (Pla_Man_t *)0x0;
        }
        else if (bVar1) {
          pPVar5 = Pla_ManPrimesDetector(local_4c);
        }
        else {
          iVar7 = 1;
          while( true ) {
            Gia_ManRandom(iVar7);
            bVar9 = uVar4 == 0;
            uVar4 = uVar4 - 1;
            if (bVar9) break;
            iVar7 = 0;
          }
          pPVar5 = Pla_ManGenerate(local_4c,local_48,local_44,fVerbose);
        }
        Pla_AbcFreeMan(pAbc);
        pAbc->pAbcPla = pPVar5;
        return 0;
      }
      if (iVar2 != 0x73) break;
      bVar9 = (bool)(bVar9 ^ 1);
    }
    if (iVar2 == 0x4f) {
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-O\" should be followed by an integer.\n";
LAB_003065aa:
        Abc_Print(-1,pcVar6);
        goto LAB_003065b4;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_48 = uVar3;
    }
    else if (iVar2 == 0x50) {
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-P\" should be followed by an integer.\n";
        goto LAB_003065aa;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_44 = uVar3;
    }
    else if (iVar2 == 0x53) {
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-S\" should be followed by an integer.\n";
        goto LAB_003065aa;
      }
      uVar4 = atoi(argv[globalUtilOptind]);
      uVar3 = uVar4;
    }
    else {
      if (iVar2 == 0x70) {
        bVar1 = (bool)(bVar1 ^ 1);
        goto LAB_00306409;
      }
      if (iVar2 != 0x49) goto LAB_003065b4;
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-I\" should be followed by an integer.\n";
        goto LAB_003065aa;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_4c = uVar3;
    }
    globalUtilOptind = iVar7 + 1;
    if ((int)uVar3 < 0) {
LAB_003065b4:
      Abc_Print(-2,"usage: |gen [-IOPS num] [-spvh]\n");
      Abc_Print(-2,"\t         generate random or specialized SOP\n");
      Abc_Print(-2,"\t-I num : the number of inputs [default = %d]\n",(ulong)local_4c);
      Abc_Print(-2,"\t-O num : the number of outputs [default = %d]\n",(ulong)local_48);
      Abc_Print(-2,"\t-P num : the number of products [default = %d]\n",(ulong)local_44);
      Abc_Print(-2,"\t-S num : ramdom seed (0 <= num <= 1000) [default = %d]\n",(ulong)uVar4);
      pcVar8 = "yes";
      pcVar6 = "yes";
      if (!bVar9) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-s     : toggle generating sorter as a PLA file [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (!bVar1) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-p     : toggle generating prime detector [default = %s]\n",pcVar6);
      if (fVerbose == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar8);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandGen( Abc_Frame_t * pAbc, int argc, char ** argv )
{
//    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int nVars;    // the number of variables
    int nLutSize = -1; // the size of LUTs
    int nLuts = -1;    // the number of LUTs
    int fAdder;
    int fSorter;
    int fMesh;
    int fMulti;
    int fFpga;
    int fOneHot;
    int fRandom;
    int fVerbose;
    char * FileName;
    char Command[1000];
    extern void Abc_GenAdder( char * pFileName, int nVars );
    extern void Abc_GenSorter( char * pFileName, int nVars );
    extern void Abc_GenMesh( char * pFileName, int nVars );
    extern void Abc_GenMulti( char * pFileName, int nVars );
    extern void Abc_GenFpga( char * pFileName, int nLutSize, int nLuts, int nVars );
    extern void Abc_GenOneHot( char * pFileName, int nVars );
    extern void Abc_GenRandom( char * pFileName, int nPis );

    // set defaults
    nVars = 8;
    fAdder = 0;
    fSorter = 0;
    fMesh = 0;
    fMulti = 0;
    fFpga = 0;
    fOneHot = 0;
    fRandom = 0;
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NKLasemftrvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nVars = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nVars < 0 )
                goto usage;
            break;
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLutSize < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nLuts = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLuts < 0 )
                goto usage;
            break;
        case 'a':
            fAdder ^= 1;
            break;
        case 's':
            fSorter ^= 1;
            break;
        case 'e':
            fMesh ^= 1;
            break;
        case 'm':
            fMulti ^= 1;
            break;
        case 'f':
            fFpga ^= 1;
            break;
        case 't':
            fOneHot ^= 1;
            break;
        case 'r':
            fRandom ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( argc != globalUtilOptind + 1 )
    {
        goto usage;
    }
    if ( nVars < 1 )
    {
        Abc_Print( -1, "The number of variables should be a positive integer.\n" );
        return 0;
    }
    // get the input file name
    FileName = argv[globalUtilOptind];
    if ( fAdder )
        Abc_GenAdder( FileName, nVars );
    else if ( fSorter )
        Abc_GenSorter( FileName, nVars );
    else if ( fMesh )
        Abc_GenMesh( FileName, nVars );
    else if ( fMulti )
        Abc_GenMulti( FileName, nVars );
    else if ( fFpga )
        Abc_GenFpga( FileName, nLutSize, nLuts, nVars );
//        Abc_GenFpga( FileName, 2, 2, 3 );
//        Abc_GenFpga( FileName, 3, 2, 5 );
    else if ( fOneHot )
        Abc_GenOneHot( FileName, nVars );
    else if ( fRandom )
        Abc_GenRandom( FileName, nVars );
    else
    {
        Abc_Print( -1, "Type of circuit is not specified.\n" );
        return 0;
    }
    // read the file just produced
    sprintf(Command, "read %s", FileName );
    Cmd_CommandExecute( pAbc, Command );
    return 0;

usage:
    Abc_Print( -2, "usage: gen [-NKL num] [-asemftrvh] <file>\n" );
    Abc_Print( -2, "\t         generates simple circuits\n" );
    Abc_Print( -2, "\t-N num : the number of variables [default = %d]\n", nVars );
    Abc_Print( -2, "\t-K num : the LUT size (to be used with switch -f) [default = %d]\n", nLutSize );
    Abc_Print( -2, "\t-L num : the LUT count (to be used with switch -f) [default = %d]\n", nLuts );
    Abc_Print( -2, "\t-a     : generate ripple-carry adder [default = %s]\n", fAdder? "yes": "no" );
    Abc_Print( -2, "\t-s     : generate a sorter [default = %s]\n", fSorter? "yes": "no" );
    Abc_Print( -2, "\t-e     : generate a mesh [default = %s]\n", fMesh? "yes": "no" );
    Abc_Print( -2, "\t-m     : generate a multiplier [default = %s]\n", fMulti? "yes": "no" );
    Abc_Print( -2, "\t-f     : generate a LUT FPGA structure [default = %s]\n", fFpga? "yes": "no" );
    Abc_Print( -2, "\t-t     : generate one-hotness conditions [default = %s]\n", fOneHot? "yes": "no" );
    Abc_Print( -2, "\t-r     : generate random single-output function [default = %s]\n", fRandom? "yes": "no" );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : output file name\n");
    return 1;
}